

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall
absl::flags_internal::anon_unknown_0::SpecifiedFlagsCompare::operator()
          (SpecifiedFlagsCompare *this,CommandLineFlag *a,CommandLineFlag *b)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 extraout_var;
  void *__s2;
  difference_type __diff;
  undefined1 auVar6 [16];
  ulong uVar4;
  ulong uVar5;
  
  auVar6 = (*(code *)**(undefined8 **)this)();
  uVar3 = auVar6._0_8_;
  iVar1 = (**a->_vptr_CommandLineFlag)(a);
  uVar4 = CONCAT44(extraout_var,iVar1);
  uVar5 = uVar4;
  if (uVar3 < uVar4) {
    uVar5 = uVar3;
  }
  if (uVar5 != 0) {
    uVar2 = memcmp(auVar6._8_8_,__s2,uVar5);
    uVar5 = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_00112250;
  }
  uVar5 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar3 - uVar4)) {
    uVar5 = uVar3 - uVar4;
  }
  if (0x7ffffffe < (long)uVar5) {
    uVar5 = 0;
  }
LAB_00112250:
  return (bool)((byte)(uVar5 >> 0x1f) & 1);
}

Assistant:

bool operator()(const CommandLineFlag* a, const CommandLineFlag* b) const {
    return a->Name() < b->Name();
  }